

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ExtractElementInst>::run
          (TypedDeleter<LLVMBC::ExtractElementInst> *this)

{
  TypedDeleter<LLVMBC::ExtractElementInst> *this_local;
  
  ExtractElementInst::~ExtractElementInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}